

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInternalState
          (AttitudeQuaternionEKF *this,Span<double,__1L> *stateBuffer)

{
  element_type eVar1;
  index_type iVar2;
  long lVar3;
  reference peVar4;
  double *pdVar5;
  long *in_RDI;
  bool ok;
  Span<double,__1L> x0_span;
  index_type in_stack_ffffffffffffff68;
  pointer ptr;
  Span<double,__1L> *in_stack_ffffffffffffff70;
  Span<double,__1L> *this_00;
  Span<double,__1L> *x0;
  DiscreteExtendedKalmanFilterHelper *this_01;
  bool local_1;
  
  iVar2 = Span<double,_-1L>::size((Span<double,__1L> *)0x624d21);
  lVar3 = (**(code **)(*in_RDI + 0x40))();
  if (iVar2 == lVar3) {
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ptr = (pointer)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x3e),0);
    *pdVar5 = (double)ptr;
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffff70,(index_type)ptr);
    this_00 = (Span<double,__1L> *)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x3e),1);
    *pdVar5 = (double)this_00;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x3e),2);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    x0 = (Span<double,__1L> *)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x3e),3);
    *pdVar5 = (double)x0;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    this_01 = (DiscreteExtendedKalmanFilterHelper *)*peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x42),0);
    *pdVar5 = (double)this_01;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x42),1);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x42),2);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x45),0);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x45),1);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x45),2);
    *pdVar5 = eVar1;
    memcpy(in_RDI + 0x48,in_RDI + 0x3e,0x50);
    serializeStateVector((AttitudeQuaternionEKF *)x0_span.storage_.super_extent_type<_1L>.size_);
    iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    Span<double,_-1L>::Span(this_00,ptr,0x625032);
    local_1 = DiscreteExtendedKalmanFilterHelper::ekfSetInitialState(this_01,x0);
  }
  else {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","setInternalState","state size mismatch, using default state"
              );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInternalState(const iDynTree::Span< double >& stateBuffer)
{
    if ((size_t)stateBuffer.size() != getInternalStateSize())
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "setInternalState", "state size mismatch, using default state");
        return false;
    }
    m_state_qekf.m_orientation(0) = stateBuffer(0);
    m_state_qekf.m_orientation(1) = stateBuffer(1);
    m_state_qekf.m_orientation(2) = stateBuffer(2);
    m_state_qekf.m_orientation(3) = stateBuffer(3);
    m_state_qekf.m_angular_velocity(0) = stateBuffer(4);
    m_state_qekf.m_angular_velocity(1) = stateBuffer(5);
    m_state_qekf.m_angular_velocity(2) = stateBuffer(6);
    m_state_qekf.m_gyroscope_bias(0) = stateBuffer(7);
    m_state_qekf.m_gyroscope_bias(1) = stateBuffer(8);
    m_state_qekf.m_gyroscope_bias(2) = stateBuffer(9);

    m_initial_state_qekf = m_state_qekf;
    serializeStateVector();
    iDynTree::Span<double> x0_span(m_x.data(), m_x.size());
    bool ok = ekfSetInitialState(x0_span);
    return ok;
}